

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_tests.cpp
# Opt level: O2

void __thiscall omp_zip_for_loop_Test::omp_zip_for_loop_Test(omp_zip_for_loop_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001898d0;
  return;
}

Assistant:

TEST(omp_zip, for_loop) {
  std::vector initial1 = {1, 2, 3, 4, 5};
  std::vector initial2 = {6, 7, 8, 9, 0};

  auto zipped = omp::zip(initial1, initial2);

  {
    auto zip_begin = std::begin(zipped), zip_end = std::end(zipped);

    auto it1 = std::cbegin(initial1);
    auto it2 = std::begin(initial2);

    for (; zip_begin != zip_end; ++zip_begin, ++it1, ++it2) {
      auto &[f, s] = *zip_begin;

      ASSERT_EQ(std::get<0>(*zip_begin), *it1);
      ASSERT_EQ(std::get<1>(*zip_begin), *it2);
    }
  }

  {
    auto it1 = std::cbegin(initial1);
    auto it2 = std::begin(initial2);

    for (const auto &[f, s] : zipped) {
      ASSERT_EQ(f, *(it1++));
      ASSERT_EQ(s, *(it2++));
    }
  }
}